

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *extraout_RAX;
  long *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  int local_34;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      iVar1 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar1 != 0) {
        paVar12 = &local_c8;
        local_d8 = paVar12;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"chdir(\"","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
        paVar13 = &local_a8;
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar3;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar3 + 2);
        if (local_b8 == paVar10) {
          local_a8._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_a8._8_8_ = plVar3[3];
          local_b8 = paVar13;
        }
        else {
          local_a8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)paVar10;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
        paVar10 = &local_128;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
        psVar6 = puVar4 + 2;
        if (local_138 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_128._M_allocated_capacity = *psVar6;
          local_128._8_8_ = puVar4[3];
          local_138 = paVar10;
        }
        else {
          local_128._M_allocated_capacity = *psVar6;
        }
        local_130 = puVar4[1];
        *puVar4 = psVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar9 = 0xf;
        if (local_138 != paVar10) {
          uVar9 = local_128._M_allocated_capacity;
        }
        paVar11 = &local_f8.field_2;
        if ((ulong)uVar9 < local_f8._M_string_length + local_130) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar11) {
            uVar9 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_f8._M_string_length + local_130) goto LAB_00132e9d;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_f8,0,0,local_138->_M_local_buf,local_130);
        }
        else {
LAB_00132e9d:
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)local_f8._M_dataplus._M_p);
        }
        local_118._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == paVar7) {
          local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_118.field_2._8_8_ = *(long *)((long)&pbVar5->field_2 + 8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_118._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        paVar7->_M_local_buf[0] = '\0';
        DeathTestAbort(&local_118);
        plVar3 = extraout_RAX;
        local_b8 = extraout_RDX;
        goto LAB_001330a6;
      }
      execv(**child_arg,*child_arg);
      paVar13 = &local_68;
      local_78 = paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"execv(","");
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
      paVar12 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pointer)*plVar3;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_f8._M_dataplus._M_p == psVar6) {
        local_f8.field_2._M_allocated_capacity = *psVar6;
        local_f8.field_2._8_8_ = plVar3[3];
        local_f8._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar6;
      }
      local_f8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      paVar10 = &local_c8;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      psVar6 = puVar4 + 2;
      if (local_d8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_c8._M_allocated_capacity = *psVar6;
        local_c8._8_8_ = puVar4[3];
        local_d8 = paVar10;
      }
      else {
        local_c8._M_allocated_capacity = *psVar6;
      }
      local_d0 = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      paVar11 = &local_a8;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      psVar6 = puVar4 + 2;
      if (local_b8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_a8._M_allocated_capacity = *psVar6;
        local_a8._8_8_ = puVar4[3];
        local_b8 = paVar11;
      }
      else {
        local_a8._M_allocated_capacity = *psVar6;
      }
      local_b0 = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar3;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if (local_138 == paVar7) {
        local_128._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_128._8_8_ = plVar3[3];
        local_138 = &local_128;
      }
      else {
        local_128._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_130 = plVar3[1];
      *plVar3 = (long)paVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      GetLastErrnoDescription_abi_cxx11_();
      uVar9 = 0xf;
      if (local_138 != &local_128) {
        uVar9 = local_128._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_98._M_string_length + local_130) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          uVar9 = local_98.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_98._M_string_length + local_130) goto LAB_0013305d;
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_98,0,0,local_138->_M_local_buf,local_130);
      }
      else {
LAB_0013305d:
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_138,(ulong)local_98._M_dataplus._M_p);
      }
      local_118._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == paVar7) {
        local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_118.field_2._8_8_ = *(long *)((long)&pbVar5->field_2 + 8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      paVar7->_M_local_buf[0] = '\0';
      local_118._M_string_length = (size_type)paVar8;
      DeathTestAbort(&local_118);
      plVar3 = extraout_RAX_00;
      local_118._M_dataplus._M_p = (pointer)extraout_RDX_00;
      goto LAB_001331bb;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  paVar12 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar13 = &local_68;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar3;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar3 + 2);
  if (local_78 == paVar10) {
    local_68._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_68._8_8_ = plVar3[3];
    local_78 = paVar13;
  }
  else {
    local_68._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)paVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
  paVar10 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)*puVar4;
  psVar6 = puVar4 + 2;
  if ((size_type *)local_f8._M_dataplus._M_p == psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = puVar4[3];
    local_f8._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
  }
  local_f8._M_string_length = puVar4[1];
  *puVar4 = psVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_34 = 0x4d3;
  StreamableToString<int>(&local_58,&local_34);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar10) {
    uVar9 = local_f8.field_2._M_allocated_capacity;
  }
  paVar11 = &local_58.field_2;
  if ((ulong)uVar9 < local_58._M_string_length + local_f8._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar11) {
      uVar9 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_f8._M_string_length <= (ulong)uVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_58,0,0,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      goto LAB_00132f26;
    }
  }
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_58._M_dataplus._M_p);
LAB_00132f26:
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (local_d8 == paVar7) {
    local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_c8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_d8 = &local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_d0 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar3;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if (local_b8 == paVar7) {
    local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_a8._8_8_ = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
LAB_001330a6:
    local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)paVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_138 == paVar7) {
    local_128._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_128._8_8_ = puVar4[3];
    local_138 = &local_128;
  }
  else {
    local_128._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_130 = puVar4[1];
  *puVar4 = paVar7;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  paVar8 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)*plVar3;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar7) {
    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_118.field_2._8_8_ = plVar3[3];
    local_118._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
LAB_001331bb:
    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_118._M_string_length = plVar3[1];
  *plVar3 = (long)paVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  DeathTestAbort(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar8) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar11) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != paVar13) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar12) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}